

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  StrWriter *this_local;
  
  operator<<(this,DAT_0063f468);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    if constexpr (I == Instr::DBF) {

        if (style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << "dbf";
        } else {
            *this << "dbra";
        }

    } else {

        *this << mnemonics[(int)I];
    }

    return *this;
}